

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall
QItemSelectionModelPrivate::initModel(QItemSelectionModelPrivate *this,QAbstractItemModel *m)

{
  long lVar1;
  QItemSelectionModel *pQVar2;
  parameter_type pQVar3;
  parameter_type in_RSI;
  QItemSelectionModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemModel *oldModel;
  QItemSelectionModel *q;
  array<QMetaObject::Connection,_12UL> *in_stack_fffffffffffffda8;
  QItemSelectionModelPrivate *in_stack_fffffffffffffdb0;
  offset_in_QItemSelectionModel_to_subr *in_stack_fffffffffffffde0;
  ContextType *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffe10;
  ConnectionType type;
  code *signal;
  Object *in_stack_fffffffffffffe18;
  Object *receiverPrivate;
  Object *in_stack_fffffffffffffe20;
  code *sender;
  ConnectionType type_00;
  Function in_stack_fffffffffffffe40;
  code *slot;
  offset_in_QAbstractItemModel_to_subr in_stack_fffffffffffffe50;
  code *signal_00;
  
  type = (ConnectionType)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  pQVar3 = QPropertyData<QAbstractItemModel_*>::valueBypassingBindings
                     (&(in_RDI->model).super_QPropertyData<QAbstractItemModel_*>);
  if (pQVar3 != in_RSI) {
    if (pQVar3 != (parameter_type)0x0) {
      (*(pQVar2->super_QObject)._vptr_QObject[0x10])();
      disconnectModel(in_stack_fffffffffffffdb0);
    }
    QPropertyData<QAbstractItemModel_*>::setValueBypassingBindings
              (&(in_RDI->model).super_QPropertyData<QAbstractItemModel_*>,in_RSI);
    if (in_RSI != (parameter_type)0x0) {
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)(QModelIndex_const&,int,int)>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe50,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe40,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)(QModelIndex_const&,int,int)>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe50,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe40,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)(QModelIndex_const&,int,int)>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe50,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe40,type);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)(QModelIndex_const&,int,int)>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe50,in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe40,type);
      signal_00 = QAbstractItemModel::rowsAboutToBeMoved;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)()>
                (in_stack_fffffffffffffe20,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsAboutToBeMoved,
                 in_stack_fffffffffffffe18,in_stack_fffffffffffffe40,type);
      slot = QAbstractItemModel::columnsAboutToBeMoved;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)()>
                (in_stack_fffffffffffffe20,(offset_in_QAbstractItemModel_to_subr)signal_00,
                 in_stack_fffffffffffffe18,(Function)QAbstractItemModel::columnsAboutToBeMoved,type)
      ;
      type_00 = 0x7f5060;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)()>
                (in_stack_fffffffffffffe20,(offset_in_QAbstractItemModel_to_subr)signal_00,
                 in_stack_fffffffffffffe18,(Function)slot,type);
      sender = QAbstractItemModel::columnsMoved;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QItemSelectionModelPrivate::*)()>
                ((Object *)QAbstractItemModel::columnsMoved,
                 (offset_in_QAbstractItemModel_to_subr)signal_00,in_stack_fffffffffffffe18,
                 (Function)slot,type);
      signal = QAbstractItemModel::layoutAboutToBeChanged;
      receiverPrivate = (Object *)0x0;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QItemSelectionModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
                ((Object *)sender,(offset_in_QAbstractItemModel_to_subr)signal_00,(Object *)0x0,
                 (Function)slot,AutoConnection);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QItemSelectionModelPrivate::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>
                ((Object *)sender,(offset_in_QAbstractItemModel_to_subr)signal_00,receiverPrivate,
                 (Function)slot,(ConnectionType)((ulong)signal >> 0x20));
      QObject::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QItemSelectionModel::*)()>
                ((Object *)QAbstractItemModel::modelReset,
                 (offset_in_QAbstractItemModel_to_subr)signal,in_stack_fffffffffffffde8,
                 in_stack_fffffffffffffde0,type_00);
      QObjectPrivate::connect<void(QObject::*)(QObject*),void(QItemSelectionModelPrivate::*)()>
                ((Object *)sender,(offset_in_QObject_to_subr)signal_00,receiverPrivate,
                 (Function)slot,(ConnectionType)((ulong)signal >> 0x20));
      std::array<QMetaObject::Connection,_12UL>::operator=
                ((array<QMetaObject::Connection,_12UL> *)in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8);
      std::array<QMetaObject::Connection,_12UL>::~array
                ((array<QMetaObject::Connection,_12UL> *)in_stack_fffffffffffffdb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelectionModelPrivate::initModel(QAbstractItemModel *m)
{
    Q_Q(QItemSelectionModel);
    const QAbstractItemModel *oldModel = model.valueBypassingBindings();
    if (oldModel == m)
        return;

    if (oldModel) {
        q->reset();
        disconnectModel();
    }

    // Caller has to call notify(), unless calling during construction (the common case).
    model.setValueBypassingBindings(m);

    if (m) {
        connections = std::array<QMetaObject::Connection, 12> {
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeRemoved,
                                    this, &QItemSelectionModelPrivate::rowsAboutToBeRemoved),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeRemoved,
                                    this, &QItemSelectionModelPrivate::columnsAboutToBeRemoved),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeInserted,
                                    this, &QItemSelectionModelPrivate::rowsAboutToBeInserted),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeInserted,
                                    this, &QItemSelectionModelPrivate::columnsAboutToBeInserted),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::layoutAboutToBeChanged,
                                    this, &QItemSelectionModelPrivate::layoutAboutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::layoutChanged,
                                    this, &QItemSelectionModelPrivate::layoutChanged),
            QObject::connect(m, &QAbstractItemModel::modelReset,
                             q, &QItemSelectionModel::reset),
            QObjectPrivate::connect(m, &QAbstractItemModel::destroyed,
                                    this, &QItemSelectionModelPrivate::modelDestroyed)
        };
    }
}